

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void QtPromisePrivate::PromiseDispatch<QFuture<void>>::
     call<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>,tst_future::finallyRejected()::__0>
               (QPromiseReject<void> *resolve,QPromiseReject<void> *reject)

{
  QFuture<void> local_30;
  QPromiseReject<void> *local_20;
  QPromiseReject<void> *reject_local;
  QPromiseResolve<void> *resolve_local;
  
  local_20 = reject;
  reject_local = resolve;
  tst_future::finallyRejected::anon_class_1_0_00000001::operator()
            (&local_30,(anon_class_1_0_00000001 *)((long)&resolve_local + 7));
  PromiseFulfill<QFuture<void>_>::call(&local_30,(QPromiseResolve<void> *)reject_local,local_20);
  QFuture<void>::~QFuture(&local_30);
  return;
}

Assistant:

static void call(const Resolve& resolve, const Reject& reject, Functor fn, Args&&... args)
    {
        try {
            PromiseFulfill<Unqualified<Result>>::call(fn(std::forward<Args>(args)...),
                                                      resolve,
                                                      reject);
        } catch (...) {
            reject(std::current_exception());
        }
    }